

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::BendTypesSectionParser::parseLine
          (BendTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  BendType *bendType;
  BendTypeParser btParser;
  string remainder;
  string at3;
  string at2;
  string at1;
  StringTokenizer tokenizer;
  undefined1 local_130 [48];
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  StringTokenizer local_80;
  
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  BendTypeParser::BendTypeParser((BendTypeParser *)local_130);
  iVar1 = StringTokenizer::countTokens(&local_80);
  if (iVar1 < 5) {
    snprintf(painCave.errMsg,2000,"BendTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_a0,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_c0,&local_80);
    StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_80);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_100,&local_80);
    bendType = BendTypeParser::parseLine
                         ((BendTypeParser *)local_130,&local_100,
                          (this->options_->BendForceConstantScaling).data_);
    if (bendType != (BendType *)0x0) {
      ForceField::addBendType(ff,&local_a0,&local_c0,&local_e0,bendType);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
               *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BendTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BendTypeParser btParser;
    BendType* bendType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBendForceConstantScaling();

    try {
      bendType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bendType != NULL) { ff.addBendType(at1, at2, at3, bendType); }
  }